

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ImVector<ImFontGlyph> *this_00;
  ImVector<unsigned_short> *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImFontGlyph *pIVar7;
  float *pfVar8;
  unsigned_short *puVar9;
  ImFontGlyph *pIVar10;
  uint uVar11;
  int i_1;
  int iVar12;
  uint i_00;
  int i;
  uint uVar13;
  float fVar14;
  
  this_00 = &this->Glyphs;
  uVar11 = 0;
  for (uVar13 = 0; uVar13 != this_00->Size; uVar13 = uVar13 + 1) {
    pIVar7 = ImVector<ImFontGlyph>::operator[](this_00,uVar13);
    if (uVar11 <= (*(uint *)pIVar7 & 0x7fffffff)) {
      uVar11 = *(uint *)pIVar7 & 0x7fffffff;
    }
  }
  if (uVar13 < 0xffff) {
    ImVector<float>::clear(&this->IndexAdvanceX);
    this_01 = &this->IndexLookup;
    ImVector<unsigned_short>::clear(this_01);
    this->DirtyLookupTables = false;
    this->Used4kPagesMap[0] = '\0';
    this->Used4kPagesMap[1] = '\0';
    GrowIndex(this,uVar11 + 1);
    for (iVar12 = 0; iVar12 < this_00->Size; iVar12 = iVar12 + 1) {
      pIVar7 = ImVector<ImFontGlyph>::operator[](this_00,iVar12);
      uVar13 = *(uint *)pIVar7;
      i_00 = uVar13 & 0x7fffffff;
      pIVar7 = ImVector<ImFontGlyph>::operator[](this_00,iVar12);
      fVar14 = pIVar7->AdvanceX;
      pfVar8 = ImVector<float>::operator[](&this->IndexAdvanceX,i_00);
      *pfVar8 = fVar14;
      puVar9 = ImVector<unsigned_short>::operator[](this_01,i_00);
      *puVar9 = (unsigned_short)iVar12;
      this->Used4kPagesMap[i_00 >> 0xf] =
           this->Used4kPagesMap[i_00 >> 0xf] | (byte)(1 << ((byte)(uVar13 >> 0xc) & 7));
    }
    pIVar7 = FindGlyph(this,0x20);
    if (pIVar7 != (ImFontGlyph *)0x0) {
      pIVar7 = ImVector<ImFontGlyph>::back(this_00);
      if (((undefined1  [40])*pIVar7 & (undefined1  [40])0x7fffffff) != (undefined1  [40])0x9) {
        ImVector<ImFontGlyph>::resize(this_00,this_00->Size + 1);
      }
      pIVar7 = ImVector<ImFontGlyph>::back(this_00);
      pIVar10 = FindGlyph(this,0x20);
      fVar14 = pIVar10->AdvanceX;
      fVar1 = pIVar10->X0;
      fVar2 = pIVar10->Y0;
      fVar3 = pIVar10->X1;
      fVar4 = pIVar10->Y1;
      fVar5 = pIVar10->U0;
      fVar6 = pIVar10->V0;
      *(undefined4 *)&pIVar7->field_0x0 = *(undefined4 *)&pIVar10->field_0x0;
      pIVar7->AdvanceX = fVar14;
      pIVar7->X0 = fVar1;
      pIVar7->Y0 = fVar2;
      pIVar7->X1 = fVar3;
      pIVar7->Y1 = fVar4;
      pIVar7->U0 = fVar5;
      pIVar7->V0 = fVar6;
      fVar14 = pIVar10->V1;
      pIVar7->U1 = pIVar10->U1;
      pIVar7->V1 = fVar14;
      *(uint *)pIVar7 = *(uint *)pIVar7 & 0x80000000 | 9;
      fVar14 = pIVar7->AdvanceX * 4.0;
      pIVar7->AdvanceX = fVar14;
      pfVar8 = ImVector<float>::operator[](&this->IndexAdvanceX,9);
      *pfVar8 = fVar14;
      iVar12 = (this->Glyphs).Size;
      puVar9 = ImVector<unsigned_short>::operator[](this_01,*(uint *)pIVar7 & 0x7fffffff);
      *puVar9 = (short)iVar12 - 1;
    }
    iVar12 = 0;
    SetGlyphVisible(this,0x20,false);
    SetGlyphVisible(this,9,false);
    pIVar7 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar7;
    fVar14 = 0.0;
    if (pIVar7 != (ImFontGlyph *)0x0) {
      fVar14 = pIVar7->AdvanceX;
    }
    this->FallbackAdvanceX = fVar14;
    for (; uVar11 + 1 != iVar12; iVar12 = iVar12 + 1) {
      pfVar8 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar12);
      if (*pfVar8 <= 0.0 && *pfVar8 != 0.0) {
        fVar14 = this->FallbackAdvanceX;
        pfVar8 = ImVector<float>::operator[](&this->IndexAdvanceX,iVar12);
        *pfVar8 = fVar14;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0xa47,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size-1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}